

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Precompute.cpp
# Opt level: O2

void __thiscall wasm::Precompute::visitExpression(Precompute *this,Expression *curr)

{
  Module *module;
  bool bVar1;
  Expression *pEVar2;
  Break *expression;
  Return *expression_00;
  Flow *this_00;
  Nop *output;
  Name name;
  Flow local_100;
  Flow local_b8;
  Builder local_70;
  Builder builder;
  Flow flow;
  
  bVar1 = Properties::isConstantExpression(curr);
  if (bVar1) {
    return;
  }
  if (curr->_id == NopId) {
    return;
  }
  precomputeExpression((Flow *)&builder,this,curr,true);
  bVar1 = canEmitConstantFor(this,(Literals *)&builder);
  if (bVar1) {
    if (flow.breakTo.super_IString.str._M_len == 0) {
      if ((long)&((builder.wasm)->exports).
                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start +
          (long)((long)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                       super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                       super__Vector_impl_data._M_start -
                flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) / 0x18
          == 0) {
        curr->_id = NopId;
        (curr->type).id = 0;
      }
      else {
        pEVar2 = Flow::getConstExpression
                           ((Flow *)&builder,
                            (this->
                            super_WalkerPass<wasm::PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>_>
                            ).
                            super_PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                            .
                            super_Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                            .currModule);
        Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>::
        replaceCurrent(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>_>
                        ).
                        super_PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                        .
                        super_Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                       ,pEVar2);
      }
    }
    else if (flow.breakTo.super_IString.str._M_len == NONCONSTANT_FLOW._8_8_) {
      considerPartiallyPrecomputing(this,curr);
    }
    else {
      if (flow.breakTo.super_IString.str._M_len == RETURN_FLOW._8_8_) {
        if (curr->_id != ReturnId) {
          module = (this->
                   super_WalkerPass<wasm::PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>_>
                   ).
                   super_PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                   .
                   super_Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                   .currModule;
          if ((long)&((builder.wasm)->exports).
                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start +
              (long)((long)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl
                           .super__Vector_impl_data._M_start -
                    flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) /
              0x18 == 0) {
            pEVar2 = (Expression *)0x0;
          }
          else {
            pEVar2 = Flow::getConstExpression((Flow *)&builder,module);
          }
          expression_00 = MixedArena::alloc<wasm::Return>(&module->allocator);
          expression_00->value = pEVar2;
          Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>::
          replaceCurrent(&(this->
                          super_WalkerPass<wasm::PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>_>
                          ).
                          super_PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                          .
                          super_Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                         ,(Expression *)expression_00);
          goto LAB_00b08427;
        }
        Flow::Flow(&local_100,(Flow *)&builder);
        reuseConstantNode<wasm::Return>(this,(Return *)curr,&local_100);
        this_00 = &local_100;
      }
      else {
        if (curr->_id != BreakId) {
          local_70.wasm =
               (this->
               super_WalkerPass<wasm::PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>_>
               ).
               super_PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
               .
               super_Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
               .currModule;
          if ((long)&((builder.wasm)->exports).
                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start +
              (long)((long)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl
                           .super__Vector_impl_data._M_start -
                    flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) /
              0x18 == 0) {
            pEVar2 = (Expression *)0x0;
          }
          else {
            pEVar2 = Flow::getConstExpression((Flow *)&builder,local_70.wasm);
          }
          name.super_IString.str._M_str = (char *)flow.breakTo.super_IString.str._M_len;
          name.super_IString.str._M_len =
               (size_t)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                       super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
          expression = Builder::makeBreak(&local_70,name,pEVar2,(Expression *)0x0);
          Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>::
          replaceCurrent(&(this->
                          super_WalkerPass<wasm::PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>_>
                          ).
                          super_PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                          .
                          super_Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                         ,(Expression *)expression);
          goto LAB_00b08427;
        }
        *(pointer *)(curr + 1) =
             flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        curr[1].type.id = flow.breakTo.super_IString.str._M_len;
        curr[2].type.id = 0;
        Flow::Flow(&local_b8,(Flow *)&builder);
        reuseConstantNode<wasm::Break>(this,(Break *)curr,&local_b8);
        this_00 = &local_b8;
      }
      SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)this_00);
    }
  }
LAB_00b08427:
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)&builder);
  return;
}

Assistant:

void visitExpression(Expression* curr) {
    // TODO: if local.get, only replace with a constant if we don't care about
    // size...?
    if (Properties::isConstantExpression(curr) || curr->is<Nop>()) {
      return;
    }
    // try to evaluate this into a const
    Flow flow = precomputeExpression(curr);
    if (!canEmitConstantFor(flow.values)) {
      return;
    }
    if (flow.breaking()) {
      if (flow.breakTo == NONCONSTANT_FLOW) {
        // This cannot be turned into a constant, but perhaps we can partially
        // precompute it.
        considerPartiallyPrecomputing(curr);
        return;
      }
      if (flow.breakTo == RETURN_FLOW) {
        // this expression causes a return. if it's already a return, reuse the
        // node
        if (auto* ret = curr->dynCast<Return>()) {
          reuseConstantNode(ret, flow);
        } else {
          Builder builder(*getModule());
          replaceCurrent(builder.makeReturn(
            flow.values.isConcrete() ? flow.getConstExpression(*getModule())
                                     : nullptr));
        }
        return;
      }
      // this expression causes a break, emit it directly. if it's already a br,
      // reuse the node.
      if (auto* br = curr->dynCast<Break>()) {
        br->name = flow.breakTo;
        br->condition = nullptr;
        reuseConstantNode(br, flow);
      } else {
        Builder builder(*getModule());
        replaceCurrent(builder.makeBreak(
          flow.breakTo,
          flow.values.isConcrete() ? flow.getConstExpression(*getModule())
                                   : nullptr));
      }
      return;
    }
    // this was precomputed
    if (flow.values.isConcrete()) {
      replaceCurrent(flow.getConstExpression(*getModule()));
    } else {
      ExpressionManipulator::nop(curr);
    }
  }